

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_appendAString_success_zeroSizeSrcArray_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  AString srcString;
  AString destString;
  
  private_ACUtilsTest_AString_constructTestString(&destString,"01234",8);
  pcVar6 = "";
  private_ACUtilsTest_AString_constructTestString(&srcString,"",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  bVar1 = AString_appendAString(&destString,&srcString);
  if (bVar1 == false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x42c,"Assertion \'AString_appendAString(&destString, &srcString)\' failed",0
                      ,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x42c);
  if (destString.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x42d);
    if (destString.buffer == (char *)0x0) {
      srcString.size = 0;
      srcString.buffer = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (destString).buffer != NULL";
      pcVar5 = "(void*) (destString).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x42d);
      pcVar7 = destString.buffer;
      if (destString.buffer == (char *)0x0) {
        pcVar7 = "(null)";
      }
      else {
        iVar2 = strcmp("01234",destString.buffer);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x42d);
          if (destString.size != 5) {
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(destString).size == strlen(\"01234\")";
            pcVar5 = "(destString).size";
            srcString.size = destString.size;
            srcString.buffer = "strlen(\"01234\")";
            goto LAB_0012cf35;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x42d);
          if (srcString.capacity == 8) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x42e);
            if (srcString.buffer == (char *)0x0) {
              srcString.size = 0;
              srcString.buffer = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar4 = "(void*) (srcString).buffer != NULL";
              pcVar5 = "(void*) (srcString).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x42e);
              if (srcString.buffer == (char *)0x0) {
                srcString.buffer = "(null)";
                srcString.size = 0x16819b;
              }
              else {
                if (*srcString.buffer == '\0') {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x42e);
                  if (srcString.size == 0) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x42e);
                    if (private_ACUtilsTest_AString_reallocCount == 0) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x42f);
                      (*destString.deallocator)(destString.buffer);
                      (*srcString.deallocator)(srcString.buffer);
                      return;
                    }
                    srcString.buffer = "(0)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar5 = "private_ACUtilsTest_AString_reallocCount";
                    iVar2 = 0x42f;
                    srcString.size = private_ACUtilsTest_AString_reallocCount;
                    goto LAB_0012d063;
                  }
                  srcString.buffer = "strlen(\"\")";
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar4 = "(srcString).size == strlen(\"\")";
                  pcVar5 = "(srcString).size";
                  goto LAB_0012d05e;
                }
                srcString.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar4 = "(srcString).buffer == (\"\")";
              pcVar5 = "(srcString).buffer";
            }
          }
          else {
            srcString.buffer = "(8)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(srcString).capacity == (8)";
            pcVar5 = "(srcString).capacity";
            srcString.size = srcString.capacity;
          }
LAB_0012d05e:
          iVar2 = 0x42e;
          goto LAB_0012d063;
        }
        pcVar6 = "\"";
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(destString).buffer == (\"01234\")";
      pcVar5 = "(destString).buffer";
      srcString.size = (size_t)pcVar6;
      srcString.buffer = pcVar7;
    }
  }
  else {
    srcString.buffer = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(destString).capacity == (8)";
    pcVar5 = "(destString).capacity";
    srcString.size = destString.capacity;
  }
LAB_0012cf35:
  iVar2 = 0x42d;
LAB_0012d063:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar4,pcVar5,srcString.size,srcString.buffer);
}

Assistant:

END_TEST
START_TEST(test_AString_appendAString_success_zeroSizeSrcArray)
{
    struct AString destString = private_ACUtilsTest_AString_constructTestString("01234", 8);
    struct AString srcString = private_ACUtilsTest_AString_constructTestString("", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_appendAString(&destString, &srcString));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(destString, "01234", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(srcString, "", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(destString);
    private_ACUtilsTest_AString_destructTestString(srcString);
}